

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testpixmap.cpp
# Opt level: O1

int main(void)

{
  ushort uVar1;
  int iVar2;
  int iVar3;
  Am_Wrapper *pAVar4;
  Am_Object *pAVar5;
  char *pcVar6;
  Am_Value *pAVar7;
  Am_Constraint *pAVar8;
  Am_Object AVar9;
  uint uVar10;
  uint uVar11;
  Am_Object settings_group;
  Am_Object bitmap2;
  Am_Object image_setting;
  Am_Object mode_setting;
  Am_Object line_setting;
  Am_Object settings;
  Am_Object how_set_inter;
  Am_Image_Array image;
  Am_Object fill_setting;
  Am_Object cmd;
  Am_Object window;
  Am_Object local_110;
  Am_Object local_108;
  Am_Object local_100;
  Am_Object local_f8;
  Am_Object local_f0;
  Am_Object local_e8;
  Am_Object local_e0;
  Am_Object local_d8;
  Am_Object local_d0;
  Am_Object local_c8;
  Am_Object local_c0;
  Am_Object local_b8;
  Am_Object local_b0;
  Am_Object local_a8;
  Am_Object local_a0;
  Am_Object local_98;
  Am_Object local_90;
  Am_Object local_88;
  Am_Object local_80;
  Am_Object local_78;
  Am_Object local_70;
  Am_Object local_68;
  Am_Object local_60;
  Am_Object local_58;
  Am_Object local_50;
  Am_Object local_48;
  Am_Object local_40;
  Am_Object local_38;
  Am_Object local_30;
  Am_Object local_28;
  Am_Object local_20;
  
  Am_Initialize();
  Am_Object::Create((char *)&local_d0);
  uVar1 = Am_Object::Set((ushort)&local_d0,(char *)0x6c,0x1050f7);
  uVar1 = Am_Object::Set(uVar1,0x66,600);
  uVar1 = Am_Object::Set(uVar1,0x67,300);
  pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Amulet_Purple);
  pAVar5 = (Am_Object *)Am_Object::Set(uVar1,(Am_Wrapper *)0x6a,(ulong)pAVar4);
  Am_Object::Am_Object(&local_b8,pAVar5);
  Am_Object::~Am_Object(&local_d0);
  pcVar6 = (char *)Am_Merge_Pathname("images/bugsmall.gif");
  Am_Image_Array::Am_Image_Array((Am_Image_Array *)&local_d0,pcVar6);
  if (pcVar6 != (char *)0x0) {
    operator_delete__(pcVar6);
  }
  Am_Object::Create((char *)&local_100);
  uVar1 = Am_Object::Set((ushort)&local_100,100,10);
  uVar1 = Am_Object::Set(uVar1,0x65,10);
  pAVar4 = Am_Image_Array::operator_cast_to_Am_Wrapper_((Am_Image_Array *)&local_d0);
  pAVar5 = (Am_Object *)Am_Object::Set(uVar1,(Am_Wrapper *)0xb0,(ulong)pAVar4);
  Am_Object::operator=(&bitmap,pAVar5);
  Am_Object::~Am_Object(&local_100);
  Am_Object::Am_Object(&local_20,&bitmap);
  Am_Object::Add_Part((Am_Object_Data *)&local_b8,SUB81(&local_20,0),1);
  Am_Object::~Am_Object(&local_20);
  pcVar6 = (char *)Am_Merge_Pathname("images/eye10.gif");
  Am_Image_Array::Am_Image_Array((Am_Image_Array *)&local_100,pcVar6);
  Am_Image_Array::operator=((Am_Image_Array *)&local_d0,(Am_Image_Array *)&local_100);
  Am_Image_Array::~Am_Image_Array((Am_Image_Array *)&local_100);
  if (pcVar6 != (char *)0x0) {
    operator_delete__(pcVar6);
  }
  Am_Object::Create((char *)&local_d8);
  pAVar4 = Am_Image_Array::operator_cast_to_Am_Wrapper_((Am_Image_Array *)&local_d0);
  pAVar5 = (Am_Object *)Am_Object::Set((ushort)&local_d8,(Am_Wrapper *)0xb0,(ulong)pAVar4);
  Am_Object::Am_Object(&local_100,pAVar5);
  Am_Object::~Am_Object(&local_d8);
  Am_Object::Am_Object(&local_28,&local_100);
  Am_Object::Add_Part((Am_Object_Data *)&local_b8,SUB81(&local_28,0),1);
  Am_Object::~Am_Object(&local_28);
  Am_Object::Am_Object(&local_30,&local_100);
  Am_To_Bottom((Am_Object_Data *)&local_30);
  Am_Object::~Am_Object(&local_30);
  Am_Object::Create((char *)&local_c0);
  uVar1 = Am_Object::Set((ushort)&local_c0,(char *)0xb9,0x10514e);
  pAVar5 = (Am_Object *)Am_Object::Set(uVar1,true,1);
  Am_Object::Am_Object(&local_d8,pAVar5);
  Am_Object::~Am_Object(&local_c0);
  pAVar7 = (Am_Value *)Am_Object::Get((ushort)&local_d8,0xc5);
  Am_Object::Am_Object(&local_c0,pAVar7);
  Am_Object::Set((ushort)&local_c0,(Am_Method_Wrapper *)0xca,(ulong)change_setting.from_wrapper);
  Am_Object::Am_Object(&local_38,&local_d8);
  Am_Object::Add_Part((Am_Object_Data *)&local_b8,SUB81(&local_38,0),1);
  Am_Object::~Am_Object(&local_38);
  Am_Object::Create((char *)&local_e0);
  uVar1 = Am_Object::Set((ushort)&local_e0,0x65,100);
  uVar1 = Am_Object::Set(uVar1,100,10);
  pAVar8 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)&Am_Width_Of_Parts);
  uVar1 = Am_Object::Set(uVar1,(Am_Constraint *)0x66,(ulong)pAVar8);
  pAVar8 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)&Am_Height_Of_Parts);
  pAVar5 = (Am_Object *)Am_Object::Set(uVar1,(Am_Constraint *)0x67,(ulong)pAVar8);
  Am_Object::Am_Object(&local_108,pAVar5);
  Am_Object::~Am_Object(&local_e0);
  Am_Object::Create((char *)&local_c8);
  pAVar5 = (Am_Object *)Am_Object::Set((ushort)&local_c8,(char *)0xab,0x10516a);
  Am_Object::Am_Object(&local_e0,pAVar5);
  Am_Object::~Am_Object(&local_c8);
  Am_Object::Am_Object(&local_40,&local_e0);
  Am_Object::Add_Part((Am_Object_Data *)&local_108,SUB81(&local_40,0),1);
  Am_Object::~Am_Object(&local_40);
  pAVar7 = (Am_Value *)Am_Object::Get((ushort)&local_e0,0x67);
  iVar2 = Am_Value::operator_cast_to_int(pAVar7);
  pAVar7 = (Am_Value *)Am_Object::Get((ushort)&local_e0,0x67);
  iVar3 = Am_Value::operator_cast_to_int(pAVar7);
  Am_Object::Create((char *)&local_e8);
  uVar10 = iVar2 + 2;
  uVar1 = Am_Object::Set((ushort)&local_e8,0x65,(ulong)uVar10);
  pAVar5 = (Am_Object *)Am_Object::Set(uVar1,(char *)0xab,0x105187);
  Am_Object::Am_Object(&local_c8,pAVar5);
  Am_Object::~Am_Object(&local_e8);
  Am_Object::Am_Object(&local_48,&local_c8);
  AVar9.data = (Am_Object_Data *)
               Am_Object::Add_Part((Am_Object_Data *)&local_108,SUB81(&local_48,0),1);
  Am_Object::Create((char *)&local_e8);
  uVar11 = iVar3 + uVar10;
  uVar1 = Am_Object::Set((ushort)&local_e8,0x65,(ulong)uVar11);
  pAVar5 = (Am_Object *)Am_Object::Set(uVar1,0x66,0x87);
  Am_Object::Am_Object(&local_50,pAVar5);
  Am_Object::Add_Part(AVar9,SUB81(&local_50,0),1);
  Am_Object::~Am_Object(&local_50);
  Am_Object::~Am_Object(&local_e8);
  Am_Object::~Am_Object(&local_48);
  Am_Object::Create((char *)&local_f0);
  uVar1 = Am_Object::Set((ushort)&local_f0,0x65,(ulong)uVar10);
  uVar1 = Am_Object::Set(uVar1,100,0x91);
  pAVar5 = (Am_Object *)Am_Object::Set(uVar1,(char *)0xab,0x1051a5);
  Am_Object::Am_Object(&local_e8,pAVar5);
  Am_Object::~Am_Object(&local_f0);
  Am_Object::Am_Object(&local_58,&local_e8);
  AVar9.data = (Am_Object_Data *)
               Am_Object::Add_Part((Am_Object_Data *)&local_108,SUB81(&local_58,0),1);
  Am_Object::Create((char *)&local_f0);
  uVar1 = Am_Object::Set((ushort)&local_f0,0x65,(ulong)uVar11);
  uVar1 = Am_Object::Set(uVar1,100,0x91);
  pAVar5 = (Am_Object *)Am_Object::Set(uVar1,0x66,0x87);
  Am_Object::Am_Object(&local_60,pAVar5);
  Am_Object::Add_Part(AVar9,SUB81(&local_60,0),1);
  Am_Object::~Am_Object(&local_60);
  Am_Object::~Am_Object(&local_f0);
  Am_Object::~Am_Object(&local_58);
  Am_Object::Create((char *)&local_f8);
  uVar1 = Am_Object::Set((ushort)&local_f8,0x65,(ulong)uVar10);
  uVar1 = Am_Object::Set(uVar1,100,0x122);
  pAVar5 = (Am_Object *)Am_Object::Set(uVar1,(char *)0xab,0x1051bd);
  Am_Object::Am_Object(&local_f0,pAVar5);
  Am_Object::~Am_Object(&local_f8);
  Am_Object::Am_Object(&local_68,&local_f0);
  AVar9.data = (Am_Object_Data *)
               Am_Object::Add_Part((Am_Object_Data *)&local_108,SUB81(&local_68,0),1);
  Am_Object::Create((char *)&local_f8);
  uVar1 = Am_Object::Set((ushort)&local_f8,0x65,(ulong)uVar11);
  uVar1 = Am_Object::Set(uVar1,100,0x122);
  pAVar5 = (Am_Object *)Am_Object::Set(uVar1,0x66,0x87);
  Am_Object::Am_Object(&local_70,pAVar5);
  Am_Object::Add_Part(AVar9,SUB81(&local_70,0),1);
  Am_Object::~Am_Object(&local_70);
  Am_Object::~Am_Object(&local_f8);
  Am_Object::~Am_Object(&local_68);
  Am_Object::Create((char *)&local_110);
  uVar1 = Am_Object::Set((ushort)&local_110,0x65,(ulong)uVar10);
  uVar1 = Am_Object::Set(uVar1,100,0x1b3);
  pAVar5 = (Am_Object *)Am_Object::Set(uVar1,(char *)0xab,0x1051d8);
  Am_Object::Am_Object(&local_f8,pAVar5);
  Am_Object::~Am_Object(&local_110);
  Am_Object::Am_Object(&local_78,&local_f8);
  AVar9.data = (Am_Object_Data *)
               Am_Object::Add_Part((Am_Object_Data *)&local_108,SUB81(&local_78,0),1);
  Am_Object::Create((char *)&local_110);
  uVar1 = Am_Object::Set((ushort)&local_110,0x65,(ulong)uVar11);
  uVar1 = Am_Object::Set(uVar1,100,0x1b3);
  pAVar5 = (Am_Object *)Am_Object::Set(uVar1,0x66,0x87);
  Am_Object::Am_Object(&local_80,pAVar5);
  Am_Object::Add_Part(AVar9,SUB81(&local_80,0),1);
  Am_Object::~Am_Object(&local_80);
  Am_Object::~Am_Object(&local_110);
  Am_Object::~Am_Object(&local_78);
  Am_Object::Create((char *)&local_110);
  uVar10 = uVar10 * 2 + 3;
  uVar1 = Am_Object::Set((ushort)&local_110,0x65,(ulong)uVar10);
  pAVar5 = (Am_Object *)Am_Object::Set(uVar1,(char *)0xab,0x1051ee);
  Am_Object::operator=(&fill_style,pAVar5);
  Am_Object::~Am_Object(&local_110);
  Am_Object::Am_Object(&local_88,&fill_style);
  Am_Object::Add_Part((Am_Object_Data *)&local_108,SUB81(&local_88,0),1);
  Am_Object::~Am_Object(&local_88);
  Am_Object::Create((char *)&local_110);
  uVar1 = Am_Object::Set((ushort)&local_110,0x65,(ulong)uVar10);
  uVar1 = Am_Object::Set(uVar1,100,0x91);
  pAVar5 = (Am_Object *)Am_Object::Set(uVar1,(char *)0xab,0x10520f);
  Am_Object::operator=(&line_style,pAVar5);
  Am_Object::~Am_Object(&local_110);
  Am_Object::Am_Object(&local_90,&line_style);
  Am_Object::Add_Part((Am_Object_Data *)&local_108,SUB81(&local_90,0),1);
  Am_Object::~Am_Object(&local_90);
  Am_Object::Create((char *)&local_110);
  uVar1 = Am_Object::Set((ushort)&local_110,0x65,(ulong)uVar10);
  uVar1 = Am_Object::Set(uVar1,100,0x122);
  pAVar5 = (Am_Object *)Am_Object::Set(uVar1,(char *)0xab,0x105227);
  Am_Object::operator=(&mode,pAVar5);
  Am_Object::~Am_Object(&local_110);
  Am_Object::Am_Object(&local_98,&mode);
  Am_Object::Add_Part((Am_Object_Data *)&local_108,SUB81(&local_98,0),1);
  Am_Object::~Am_Object(&local_98);
  Am_Object::Create((char *)&local_110);
  uVar1 = Am_Object::Set((ushort)&local_110,0x65,(ulong)uVar10);
  uVar1 = Am_Object::Set(uVar1,100,0x1b3);
  pAVar5 = (Am_Object *)Am_Object::Set(uVar1,(char *)0xab,0x105111);
  Am_Object::operator=(&image_name,pAVar5);
  Am_Object::~Am_Object(&local_110);
  Am_Object::Am_Object(&local_a0,&image_name);
  Am_Object::Add_Part((Am_Object_Data *)&local_108,SUB81(&local_a0,0),1);
  Am_Object::~Am_Object(&local_a0);
  Am_Object::Am_Object(&local_a8,&local_108);
  Am_Object::Add_Part((Am_Object_Data *)&local_b8,SUB81(&local_a8,0),1);
  Am_Object::~Am_Object(&local_a8);
  Am_Object::Am_Object(&local_b0,&local_b8);
  Am_Object::Add_Part((Am_Object_Data *)&Am_Screen,SUB81(&local_b0,0),1);
  Am_Object::~Am_Object(&local_b0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Type \'1\' to display ent.xbm",0x1b);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
  std::ostream::put('@');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Type \'2\' to display ent.gif (transparent)",0x29);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
  std::ostream::put('@');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Type \'3\' to display opaque_ent.gif",0x22);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
  std::ostream::put('@');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Type \'4\' to display eye10.gif (transparent)",0x2b);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
  std::ostream::put('@');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Type \'5\' to display opaque_eye10.gif",0x24);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
  std::ostream::put('@');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Type \'6\' to display spaceship.gif (transparent)",0x2f);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
  std::ostream::put('@');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Type \'7\' to display opaque_spaceship.gif",0x28);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
  std::ostream::put('@');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Type \'b\' to set fill style to Am_Black",0x26);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
  std::ostream::put('@');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Type \'g\' to set fill style to Am_Green",0x26);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
  std::ostream::put('@');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Type \'n\' to set fill style to Am_No_Style",0x29);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
  std::ostream::put('@');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Type \'r\' to set fill style to Am_Red",0x24);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
  std::ostream::put('@');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Type \'w\' to set fill style to Am_White",0x26);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
  std::ostream::put('@');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Type \'B\' to set line style to Am_Black",0x26);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
  std::ostream::put('@');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Type \'G\' to set line style to Am_Green",0x26);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
  std::ostream::put('@');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Type \'N\' to set line style to Am_No_Style",0x29);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
  std::ostream::put('@');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Type \'R\' to set line style to Am_Red",0x24);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
  std::ostream::put('@');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Type \'W\' to set line style to Am_White",0x26);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
  std::ostream::put('@');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Type \'m\' to set draw monochrome to true",0x27);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
  std::ostream::put('@');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Type \'c\' to set draw monochrome to false",0x28);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
  std::ostream::put('@');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Type \'f\' to read a nonexistent file",0x23);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
  std::ostream::put('@');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "Type \'t\' to print the current image in RBG form first row first",0x3f);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
  std::ostream::put('@');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Type \'T\' to print bugsmall.gif in RBG form first row last",
             0x39);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
  std::ostream::put('@');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "Type \'z\' to print and display spiral bitmap in RBG form first row first",0x47);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
  std::ostream::put('@');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Type \'Z\' to print spiral bitmap in RBG form first row last",
             0x3a);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
  std::ostream::put('@');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Type \'q\' to quit ",0x11);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
  std::ostream::put('@');
  std::ostream::flush();
  std::ostream::flush();
  Am_Main_Event_Loop();
  Am_Cleanup();
  Am_Object::~Am_Object(&local_f8);
  Am_Object::~Am_Object(&local_f0);
  Am_Object::~Am_Object(&local_e8);
  Am_Object::~Am_Object(&local_c8);
  Am_Object::~Am_Object(&local_e0);
  Am_Object::~Am_Object(&local_108);
  Am_Object::~Am_Object(&local_c0);
  Am_Object::~Am_Object(&local_d8);
  Am_Object::~Am_Object(&local_100);
  Am_Image_Array::~Am_Image_Array((Am_Image_Array *)&local_d0);
  Am_Object::~Am_Object(&local_b8);
  return 0;
}

Assistant:

int
main(void)
{
  Am_Initialize();

  Am_Object window =
      Am_Window.Create()
          .Set(Am_TITLE, "Amulet Pixmap Test")
          .Set(Am_WIDTH, 600)
          .Set(Am_HEIGHT, 300)
          .Set(Am_FILL_STYLE,
               Am_Amulet_Purple) // tests putting on top of color backgrounds
      ;

  const char *pathname = Am_Merge_Pathname("images/bugsmall.gif");
  Am_Image_Array image = Am_Image_Array(pathname);
  delete[] pathname;
  bitmap = Am_Bitmap.Create("bitmap")
               .Set(Am_LEFT, 10)
               .Set(Am_TOP, 10)
               .Set(Am_IMAGE, image);
  window.Add_Part(bitmap);

  pathname = Am_Merge_Pathname("images/eye10.gif");
  image = Am_Image_Array(pathname);
  delete[] pathname;
  Am_Object bitmap2 = Am_Bitmap.Create("bitmap2").Set(Am_IMAGE, image);
  window.Add_Part(bitmap2);
  Am_To_Bottom(bitmap2);

  Am_Object how_set_inter = Am_One_Shot_Interactor.Create("change_settings")
                                .Set(Am_START_WHEN, "ANY_KEYBOARD")
                                .Set(Am_START_WHERE_TEST, true);
  Am_Object cmd = how_set_inter.Get(Am_COMMAND);
  cmd.Set(Am_DO_METHOD, change_setting);
  window.Add_Part(how_set_inter);

  Am_Object settings_group = Am_Group.Create("settings group")
                                 .Set(Am_TOP, 100)
                                 .Set(Am_LEFT, 10)
                                 .Set(Am_WIDTH, Am_Width_Of_Parts)
                                 .Set(Am_HEIGHT, Am_Height_Of_Parts);

  Am_Object settings = Am_Text.Create("settings").Set(Am_TEXT, "Settings:");
  settings_group.Add_Part(settings);

  int text_spacing = (int)settings.Get(Am_HEIGHT) + 2;
  int line_position = text_spacing + (int)settings.Get(Am_HEIGHT);

  Am_Object fill_setting = Am_Text.Create("fill style setting")
                               .Set(Am_TOP, text_spacing)
                               .Set(Am_TEXT, "Fill Style");
  settings_group.Add_Part(fill_setting)
      .Add_Part(Am_Line.Create().Set(Am_TOP, line_position).Set(Am_WIDTH, 135));

  Am_Object line_setting = Am_Text.Create("line style setting")
                               .Set(Am_TOP, text_spacing)
                               .Set(Am_LEFT, 145)
                               .Set(Am_TEXT, "Line Style");
  settings_group.Add_Part(line_setting)
      .Add_Part(Am_Line.Create()
                    .Set(Am_TOP, line_position)
                    .Set(Am_LEFT, 145)
                    .Set(Am_WIDTH, 135));

  Am_Object mode_setting = Am_Text.Create("mode setting")
                               .Set(Am_TOP, text_spacing)
                               .Set(Am_LEFT, 290)
                               .Set(Am_TEXT, "Drawing Mode");
  settings_group.Add_Part(mode_setting)
      .Add_Part(Am_Line.Create()
                    .Set(Am_TOP, line_position)
                    .Set(Am_LEFT, 290)
                    .Set(Am_WIDTH, 135));

  Am_Object image_setting = Am_Text.Create("image setting")
                                .Set(Am_TOP, text_spacing)
                                .Set(Am_LEFT, 435)
                                .Set(Am_TEXT, "Image Name");
  settings_group.Add_Part(image_setting)
      .Add_Part(Am_Line.Create()
                    .Set(Am_TOP, line_position)
                    .Set(Am_LEFT, 435)
                    .Set(Am_WIDTH, 135));

  text_spacing = (text_spacing * 2) + 3;

  fill_style = Am_Text.Create("fill style")
                   .Set(Am_TOP, text_spacing)
                   .Set(Am_TEXT, "Am_No_Style (default)");
  settings_group.Add_Part(fill_style);

  line_style = Am_Text.Create("line style")
                   .Set(Am_TOP, text_spacing)
                   .Set(Am_LEFT, 145)
                   .Set(Am_TEXT, "Am_Black (default)");
  settings_group.Add_Part(line_style);

  mode = Am_Text.Create("mode")
             .Set(Am_TOP, text_spacing)
             .Set(Am_LEFT, 290)
             .Set(Am_TEXT, "color");
  settings_group.Add_Part(mode);

  image_name = Am_Text.Create("image name")
                   .Set(Am_TOP, text_spacing)
                   .Set(Am_LEFT, 435)
                   .Set(Am_TEXT, "bugsmall.gif");
  settings_group.Add_Part(image_name);

  window.Add_Part(settings_group);
  Am_Screen.Add_Part(window);

  cout << "Type '1' to display ent.xbm" << endl;
  cout << "Type '2' to display ent.gif (transparent)" << endl;
  cout << "Type '3' to display opaque_ent.gif" << endl;
  cout << "Type '4' to display eye10.gif (transparent)" << endl;
  cout << "Type '5' to display opaque_eye10.gif" << endl;
  cout << "Type '6' to display spaceship.gif (transparent)" << endl;
  cout << "Type '7' to display opaque_spaceship.gif" << endl;
  cout << "Type 'b' to set fill style to Am_Black" << endl;
  cout << "Type 'g' to set fill style to Am_Green" << endl;
  cout << "Type 'n' to set fill style to Am_No_Style" << endl;
  cout << "Type 'r' to set fill style to Am_Red" << endl;
  cout << "Type 'w' to set fill style to Am_White" << endl;
  cout << "Type 'B' to set line style to Am_Black" << endl;
  cout << "Type 'G' to set line style to Am_Green" << endl;
  cout << "Type 'N' to set line style to Am_No_Style" << endl;
  cout << "Type 'R' to set line style to Am_Red" << endl;
  cout << "Type 'W' to set line style to Am_White" << endl;
  cout << "Type 'm' to set draw monochrome to true" << endl;
  cout << "Type 'c' to set draw monochrome to false" << endl;
  cout << "Type 'f' to read a nonexistent file" << endl;
  cout << "Type 't' to print the current image in RBG form first row first"
       << endl;
  cout << "Type 'T' to print bugsmall.gif in RBG form first row last" << endl;
  cout << "Type 'z' to print and display spiral bitmap in RBG form first row "
          "first"
       << endl;
  cout << "Type 'Z' to print spiral bitmap in RBG form first row last" << endl;
  cout << "Type 'q' to quit " << endl << flush;

  Am_Main_Event_Loop();
  Am_Cleanup();

  return 0;
}